

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O0

int __thiscall CShInstruction::getImmediateBits(CShInstruction *this,ShImmediateType type)

{
  ShImmediateType type_local;
  CShInstruction *this_local;
  
  if (type == Immediate4) {
    this_local._4_4_ = 4;
  }
  else if (type == Immediate8) {
    this_local._4_4_ = 8;
  }
  else if (type == Immediate12) {
    this_local._4_4_ = 0xc;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CShInstruction::getImmediateBits(ShImmediateType type)
{
	switch (type)
	{
	case ShImmediateType::Immediate4:
		return 4;
	case ShImmediateType::Immediate8:
		return 8;
	case ShImmediateType::Immediate12:
		return 12;
	default:
		return 0;
	}
}